

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

bool __thiscall S2Polygon::Intersects(S2Polygon *this,S2Polygon *b)

{
  bool bVar1;
  MutableS2ShapeIndex *b_00;
  Options local_48;
  S2Polygon *local_20;
  S2Polygon *b_local;
  S2Polygon *this_local;
  
  local_20 = b;
  b_local = this;
  bVar1 = S2LatLngRect::Intersects(&this->bound_,&b->bound_);
  if (bVar1) {
    bVar1 = is_full(this);
    if ((bVar1) && (bVar1 = is_full(local_20), bVar1)) {
      this_local._7_1_ = 1;
    }
    else {
      b_00 = &local_20->index_;
      S2BooleanOperation::Options::Options(&local_48);
      this_local._7_1_ =
           S2BooleanOperation::Intersects
                     (&(this->index_).super_S2ShapeIndex,&b_00->super_S2ShapeIndex,&local_48);
      S2BooleanOperation::Options::~Options(&local_48);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool S2Polygon::Intersects(const S2Polygon* b) const {
  // It's worth checking bounding rectangles, since they are precomputed.
  if (!bound_.Intersects(b->bound_)) return false;

  // The following case is not handled by S2BooleanOperation because it only
  // determines whether the boundary of the result is empty (which does not
  // distinguish between the full and empty polygons).
  if (is_full() && b->is_full()) return true;

  return S2BooleanOperation::Intersects(index_, b->index_);
}